

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void direct_partition_merging
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
               int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  int_mv *piVar1;
  CANDIDATE_MV *pCVar2;
  CANDIDATE_MV *pCVar3;
  BLOCK_SIZE bsize_00;
  char cVar4;
  MOTION_MODE MVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint8_t uVar9;
  PARTITION_TYPE partition;
  ushort uVar10;
  int iVar11;
  int iVar12;
  uint32_t uVar13;
  MB_MODE_INFO *pMVar14;
  MB_MODE_INFO *pMVar15;
  MB_MODE_INFO *pMVar16;
  MB_MODE_INFO *pMVar17;
  MB_MODE_INFO_EXT_FRAME *pMVar18;
  CANDIDATE_MV CVar19;
  CANDIDATE_MV CVar20;
  CANDIDATE_MV CVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  MACROBLOCKD *xd;
  BLOCK_SIZE BVar25;
  int_mv (*paiVar26) [8];
  RefCntBuffer *pRVar27;
  byte bVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  YV12_BUFFER_CONFIG *src;
  MB_MODE_INFO **ppMVar32;
  ulong uVar33;
  ushort uVar34;
  uint uVar35;
  uint __c;
  long lVar36;
  ushort uVar37;
  scale_factors *psVar38;
  undefined4 in_register_00000084;
  int iVar39;
  byte bVar40;
  bool bVar41;
  bool bVar42;
  undefined4 uVar43;
  undefined1 auVar44 [16];
  ThreadData_conflict *pTVar45;
  _Bool use_scaled_ref;
  long local_698;
  undefined8 local_690;
  ulong local_688;
  ulong local_680;
  ulong local_678;
  MACROBLOCKD *local_670;
  TileDataEnc *local_668;
  AV1_COMMON *local_660;
  int_mv frame_mv [25] [8];
  buf_2d yv12_mb [8] [3];
  
  local_690 = CONCAT44(in_register_00000084,mi_row);
  local_678 = (ulong)(uint)mi_col;
  uVar33 = (ulong)bsize;
  bVar40 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar33];
  uVar29 = (ulong)(bVar40 >> 1);
  if (uVar33 < 3) {
LAB_001e532a:
    bVar28 = 0;
  }
  else {
    iVar39 = (cpi->common).mi_params.mi_rows;
    bVar28 = 0xff;
    if ((mi_row < iVar39) && (iVar11 = (cpi->common).mi_params.mi_cols, mi_col < iVar11)) {
      iVar12 = (cpi->common).mi_params.mi_stride;
      ppMVar32 = (cpi->common).mi_params.mi_grid_base;
      lVar36 = (long)(iVar12 * mi_row + mi_col);
      BVar25 = ppMVar32[lVar36]->bsize;
      if (BVar25 == bsize) goto LAB_001e532a;
      bVar6 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar33];
      bVar7 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar25];
      bVar8 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar25];
      if (bsize != BLOCK_8X8) {
        uVar35 = (uint)bVar6;
        local_698 = CONCAT44(local_698._4_4_,uVar35);
        if (((int)(mi_row + (uint)(bVar40 >> 1)) < iVar39) &&
           ((int)(mi_col + (uint)(bVar6 >> 1)) < iVar11)) {
          if (bVar8 == bVar40) {
            bVar28 = 8;
            if ((uint)bVar7 << 2 != uVar35) {
              bVar28 = (ppMVar32[lVar36 + (int)((uint)(bVar6 >> 1) * iVar12)]->bsize != BVar25) *
                       '\x04' + 1;
            }
          }
          else {
            local_680._0_4_ = (uint)bVar40;
            if (bVar7 == bVar6) {
              bVar28 = 9;
              if ((uint)bVar8 << 2 != (uint)local_680) {
                bVar28 = (ppMVar32[lVar36 + uVar29]->bsize != BVar25) * '\x05' + 2;
              }
            }
            else {
              bVar28 = 3;
              if (((uint)bVar7 * 2 == uVar35 && (uint)bVar8 * 2 == (uint)local_680) &&
                 (bVar28 = 4,
                 "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [ppMVar32[lVar36 + (int)((uint)(bVar6 >> 1) * iVar12)]->bsize] != bVar40)) {
                bVar28 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [ppMVar32[lVar36 + uVar29]->bsize] == bVar6) * '\x03' + 3;
              }
            }
          }
          goto LAB_001e532c;
        }
      }
      bVar28 = *(byte *)((long)&get_partition_base_partitions +
                        (ulong)(bVar7 < bVar6) + (ulong)(bVar8 < bVar40) * 2);
    }
  }
LAB_001e532c:
  BVar25 = BLOCK_INVALID;
  if (bVar28 == 0xff) goto LAB_001e53a1;
  uVar30 = uVar33;
  switch(uVar33) {
  case 0:
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001e534c_caseD_1:
    uVar30 = 6;
    bVar42 = true;
    goto LAB_001e5386;
  case 3:
    uVar30 = 1;
    break;
  case 6:
    uVar30 = 2;
    break;
  case 9:
    uVar30 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar30 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001e534c_caseD_1;
      uVar30 = 5;
    }
  }
  bVar42 = false;
LAB_001e5386:
  if (!bVar42) {
    BVar25 = subsize_lookup[bVar28][uVar30];
  }
LAB_001e53a1:
  pMVar14 = *mib;
  bsize_00 = pMVar14->bsize;
  if ((BVar25 <= bsize_00) && (pMVar15 = mib[uVar29], BVar25 <= pMVar15->bsize)) {
    pMVar16 = mib[(long)(cpi->common).mi_params.mi_stride * uVar29];
    if ((((BVar25 <= pMVar16->bsize) &&
         (((((pMVar17 = (mib + (long)(cpi->common).mi_params.mi_stride * uVar29)[uVar29],
             BVar25 <= pMVar17->bsize && (pMVar14->skip_txfm != '\0')) &&
            (pMVar15->skip_txfm != '\0')) &&
           ((pMVar16->skip_txfm != '\0' && (pMVar17->skip_txfm != '\0')))) &&
          (cVar4 = pMVar14->ref_frame[1], cVar4 == pMVar15->ref_frame[1])))) &&
        ((((cVar4 == pMVar16->ref_frame[1] && (cVar4 < '\0')) && (cVar4 == pMVar17->ref_frame[1]))
         && (((((cVar4 = pMVar14->ref_frame[0], cVar4 == pMVar15->ref_frame[0] &&
                (cVar4 == pMVar16->ref_frame[0])) && ('\0' < cVar4)) &&
              ((cVar4 == pMVar17->ref_frame[0] && (bVar28 = pMVar14->mode, bVar28 == pMVar15->mode))
              )) && (((bVar28 == pMVar16->mode &&
                      (((bVar28 & 0xfd) == 0xd && (bVar28 == pMVar17->mode)))) &&
                     (uVar13 = pMVar14->mv[0].as_int, uVar13 == pMVar15->mv[0].as_int)))))))) &&
       (((((uVar13 == pMVar16->mv[0].as_int && (uVar13 == pMVar17->mv[0].as_int)) &&
          (MVar5 = pMVar14->motion_mode, MVar5 == pMVar15->motion_mode)) &&
         (((MVar5 == pMVar16->motion_mode && (MVar5 == '\0' && pMVar17->motion_mode == '\0')) &&
          ((uVar13 = (pMVar14->interp_filters).as_int, uVar13 == (pMVar15->interp_filters).as_int &&
           ((uVar13 == (pMVar16->interp_filters).as_int &&
            (uVar13 == (pMVar17->interp_filters).as_int)))))))) &&
        ((uVar37 = *(ushort *)&pMVar14->field_0xa7 & 7,
         uVar37 == (*(ushort *)&pMVar15->field_0xa7 & 7) &&
         ((uVar37 == (*(ushort *)&pMVar16->field_0xa7 & 7) &&
          (uVar37 == (*(ushort *)&pMVar17->field_0xa7 & 7))))))))) {
      local_660 = &cpi->common;
      local_670 = &(td->mb).e_mbd;
      local_688 = CONCAT71(local_688._1_7_,pMVar14->partition);
      pMVar14->bsize = bsize;
      pMVar14->partition = '\0';
      pMVar14->skip_txfm = '\x01';
      local_680 = (ulong)bVar40;
      local_668 = tile_data;
      av1_set_offsets_without_segment_id(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
      cVar4 = (*mib)->ref_frame[0];
      paiVar26 = frame_mv;
      lVar36 = 0;
      do {
        lVar31 = 0;
        do {
          piVar1 = *paiVar26 + lVar31;
          piVar1[0] = (int_mv)0x80008000;
          piVar1[1] = (int_mv)0x80008000;
          piVar1[2] = (int_mv)0x80008000;
          piVar1[3] = (int_mv)0x80008000;
          lVar31 = lVar31 + 4;
        } while (lVar31 != 8);
        lVar36 = lVar36 + 1;
        paiVar26 = paiVar26 + 1;
      } while (lVar36 != 0x19);
      *(undefined2 *)(td->mb).color_sensitivity = *(undefined2 *)(td->mb).color_sensitivity_sb;
      uVar35 = 0;
      if ((2 < (td->mb).nonrd_prune_ref_frame_search) && ((td->mb).color_sensitivity[0] != '\x02'))
      {
        uVar35 = (uint)((td->mb).color_sensitivity[1] != '\x02');
      }
      local_698 = (long)cVar4;
      find_predictors(cpi,&td->mb,cVar4,frame_mv,yv12_mb,bsize,uVar35,(int)&use_scaled_ref,
                      (_Bool *)td);
      pMVar14 = *mib;
      uVar37 = pMVar14->mv[0].as_mv.row;
      if ((*(ushort *)((long)&yv12_mb[-4][0].buf + (long)cVar4 * 4) == uVar37) &&
         (uVar10 = pMVar14->mv[0].as_mv.col,
         *(ushort *)((long)&yv12_mb[-4][0].buf + local_698 * 4 + 2) == uVar10)) {
        bVar40 = (char)local_698 - 1;
        iVar39 = -1;
        if (bVar40 < 8) {
          iVar39 = (cpi->common).remapped_ref_idx[(int)local_698 - 1];
        }
        local_688 = 0;
        psVar38 = (scale_factors *)0x0;
        if (iVar39 != -1) {
          psVar38 = (cpi->common).ref_scale_factors + iVar39;
        }
        if (psVar38->x_scale_fp != 0xffffffff) {
          if (psVar38->y_scale_fp == -1) {
            local_688 = 0;
          }
          else {
            uVar35 = psVar38->x_scale_fp ^ 0x4000;
            local_688 = (ulong)CONCAT31((int3)(uVar35 >> 8),
                                        psVar38->y_scale_fp != 0x4000 || uVar35 != 0);
          }
        }
        uVar34 = -uVar37;
        if (0 < (short)uVar37) {
          uVar34 = uVar37;
        }
        bVar42 = true;
        bVar41 = true;
        if ((uVar34 & 7) == 0) {
          uVar37 = -uVar10;
          if (0 < (short)uVar10) {
            uVar37 = uVar10;
          }
          bVar41 = (uVar37 & 7) != 0;
        }
        if ((uVar34 & 0xf) == 0) {
          uVar37 = -uVar10;
          if (0 < (short)uVar10) {
            uVar37 = uVar10;
          }
          bVar42 = (uVar37 & 0xf) != 0;
        }
        if ((byte)(bVar42 | (byte)local_688 | bVar41 | cpi->ppi->use_svc != 0) == 1) {
          uVar9 = ((cpi->common).seq_params)->monochrome;
          set_ref_ptrs(local_660,local_670,(char)local_698,pMVar14->ref_frame[1]);
          iVar39 = -1;
          if (bVar40 < 8) {
            iVar39 = (cpi->common).remapped_ref_idx[(int)local_698 - 1];
          }
          iVar11 = (uint)(uVar9 == '\0') * 2;
          if (iVar39 == -1) {
            pRVar27 = (RefCntBuffer *)0x0;
          }
          else {
            pRVar27 = (cpi->common).ref_frame_map[iVar39];
          }
          src = &pRVar27->buf;
          if (pRVar27 == (RefCntBuffer *)0x0) {
            src = (YV12_BUFFER_CONFIG *)0x0;
          }
          iVar39 = (int)local_690;
          av1_setup_pre_planes
                    (local_670,0,src,iVar39,(int)local_678,(td->mb).e_mbd.block_ref_scale_factors[0]
                     ,iVar11 + 1);
          av1_enc_build_inter_predictor
                    (local_660,local_670,iVar39,(int)local_678,(BUFFER_SET *)0x0,bsize,
                     (uint)(byte)((bVar41 | (byte)local_688 | cpi->ppi->use_svc != 0) ^ 1),iVar11);
        }
        pMVar18 = (td->mb).mbmi_ext_frame;
        pTVar45 = td;
        bVar40 = av1_ref_frame_type((*mib)->ref_frame);
        pCVar2 = (td->mb).mbmi_ext.ref_mv_stack[bVar40];
        CVar19 = pCVar2[1];
        pCVar3 = (td->mb).mbmi_ext.ref_mv_stack[bVar40] + 2;
        CVar20 = *pCVar3;
        CVar21 = pCVar3[1];
        pMVar18->ref_mv_stack[0] = *pCVar2;
        pMVar18->ref_mv_stack[1] = CVar19;
        pMVar18->ref_mv_stack[2] = CVar20;
        pMVar18->ref_mv_stack[3] = CVar21;
        *&pMVar18->weight = (td->mb).mbmi_ext.weight[bVar40];
        pMVar18->mode_context = (td->mb).mbmi_ext.mode_context[bVar40];
        pMVar18->ref_mv_count = (td->mb).mbmi_ext.ref_mv_count[bVar40];
        uVar22 = *(undefined8 *)(td->mb).mbmi_ext.global_mvs;
        uVar23 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 2);
        uVar24 = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 6);
        *(undefined8 *)(pMVar18->global_mvs + 4) = *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 4)
        ;
        *(undefined8 *)(pMVar18->global_mvs + 6) = uVar24;
        *(undefined8 *)pMVar18->global_mvs = uVar22;
        *(undefined8 *)(pMVar18->global_mvs + 2) = uVar23;
        partition = (*mib)->partition;
        BVar25 = get_partition_subsize(bsize,partition);
        xd = local_670;
        update_ext_partition_context(local_670,(int)local_690,(int)local_678,BVar25,bsize,partition)
        ;
        av1_reset_entropy_context
                  (xd,bsize,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
        bVar40 = ""[(pTVar45->mb).txfm_search_params.tx_mode_search_type];
        if (bsize == BLOCK_4X4) {
          if (""[uVar33] < bVar40) {
            bVar40 = ""[uVar33];
          }
        }
        else if (""[""[uVar33]] <= bVar40) {
          bVar40 = ""[uVar33];
        }
        pMVar14 = *mib;
        if ((pTVar45->mb).e_mbd.lossless[*(ushort *)&pMVar14->field_0xa7 & 7] != 0) {
          bVar40 = 0;
        }
        pMVar14->inter_tx_size[0xf] = bVar40;
        auVar44 = pshuflw(ZEXT216(CONCAT11(bVar40,bVar40)),ZEXT216(CONCAT11(bVar40,bVar40)),0);
        uVar43 = auVar44._0_4_;
        pMVar14->tx_size = (char)uVar43;
        pMVar14->inter_tx_size[0] = (char)((uint)uVar43 >> 8);
        pMVar14->inter_tx_size[1] = (char)((uint)uVar43 >> 0x10);
        pMVar14->inter_tx_size[2] = (char)((uint)uVar43 >> 0x18);
        *(undefined4 *)(pMVar14->inter_tx_size + 3) = uVar43;
        *(undefined4 *)(pMVar14->inter_tx_size + 7) = uVar43;
        *(undefined4 *)(pMVar14->inter_tx_size + 0xb) = uVar43;
        (pTVar45->mb).e_mbd.above_txfm_context =
             (cpi->common).above_contexts.txfm[(local_668->tile_info).tile_row] + (int)local_678;
        (pTVar45->mb).e_mbd.left_txfm_context =
             (pTVar45->mb).e_mbd.left_txfm_context_buffer + ((uint)local_690 & 0x1f);
        pMVar14 = *mib;
        bVar40 = (pTVar45->mb).e_mbd.width;
        bVar28 = (pTVar45->mb).e_mbd.height;
        if (pMVar14->skip_txfm == '\0') {
          bVar42 = true;
        }
        else if ((pMVar14->field_0xa7 & 0x80) == 0) {
          bVar42 = pMVar14->ref_frame[0] < '\x01';
        }
        else {
          bVar42 = false;
        }
        if (bVar42) {
          uVar35 = tx_size_high[pMVar14->tx_size];
        }
        else {
          uVar35 = (uint)bVar28 * 4 & 0xff;
        }
        if ((ulong)bVar40 != 0) {
          if (bVar42) {
            __c = tx_size_wide[pMVar14->tx_size];
          }
          else {
            __c = (uint)bVar40 * 4 & 0xff;
          }
          memset((pTVar45->mb).e_mbd.above_txfm_context,__c,(ulong)bVar40);
        }
        if ((ulong)bVar28 != 0) {
          memset((pTVar45->mb).e_mbd.left_txfm_context,uVar35 & 0xff,(ulong)bVar28);
        }
        uVar33 = (ulong)((int)local_680 + (uint)((int)local_680 == 0));
        iVar39 = (cpi->common).mi_params.mi_stride;
        uVar29 = 0;
        ppMVar32 = mib;
        do {
          uVar30 = 0;
          do {
            ppMVar32[uVar30] = *mib;
            uVar30 = uVar30 + 1;
          } while (uVar33 != uVar30);
          uVar29 = uVar29 + 1;
          ppMVar32 = ppMVar32 + iVar39;
        } while (uVar29 != uVar33);
      }
      else {
        pMVar14->bsize = bsize_00;
        pMVar14->partition = (byte)local_688;
        pTVar45 = td;
        av1_set_offsets_without_segment_id
                  (cpi,&local_668->tile_info,&td->mb,(int)local_690,(int)local_678,bsize_00);
        find_predictors(cpi,&td->mb,(MV_REFERENCE_FRAME)local_698,frame_mv,yv12_mb,(*mib)->bsize,
                        uVar35,(int)&use_scaled_ref,(_Bool *)pTVar45);
      }
    }
  }
  return;
}

Assistant:

static void direct_partition_merging(AV1_COMP *cpi, ThreadData *td,
                                     TileDataEnc *tile_data, MB_MODE_INFO **mib,
                                     int mi_row, int mi_col, BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  const PARTITION_TYPE partition =
      (bsize >= BLOCK_8X8) ? get_partition(cm, mi_row, mi_col, bsize)
                           : PARTITION_NONE;
  BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);

  MB_MODE_INFO **b0 = mib;
  MB_MODE_INFO **b1 = mib + hbs;
  MB_MODE_INFO **b2 = mib + hbs * mi_params->mi_stride;
  MB_MODE_INFO **b3 = mib + hbs * mi_params->mi_stride + hbs;

  // Check if the following conditions are met. This can be updated
  // later with more support added.
  const int further_split = b0[0]->bsize < subsize || b1[0]->bsize < subsize ||
                            b2[0]->bsize < subsize || b3[0]->bsize < subsize;
  if (further_split) return;

  const int no_skip = !b0[0]->skip_txfm || !b1[0]->skip_txfm ||
                      !b2[0]->skip_txfm || !b3[0]->skip_txfm;
  if (no_skip) return;

  const int compound = (b0[0]->ref_frame[1] != b1[0]->ref_frame[1] ||
                        b0[0]->ref_frame[1] != b2[0]->ref_frame[1] ||
                        b0[0]->ref_frame[1] != b3[0]->ref_frame[1] ||
                        b0[0]->ref_frame[1] > NONE_FRAME);
  if (compound) return;

  // Intra modes aren't considered here.
  const int different_ref = (b0[0]->ref_frame[0] != b1[0]->ref_frame[0] ||
                             b0[0]->ref_frame[0] != b2[0]->ref_frame[0] ||
                             b0[0]->ref_frame[0] != b3[0]->ref_frame[0] ||
                             b0[0]->ref_frame[0] <= INTRA_FRAME);
  if (different_ref) return;

  const int different_mode =
      (b0[0]->mode != b1[0]->mode || b0[0]->mode != b2[0]->mode ||
       b0[0]->mode != b3[0]->mode);
  if (different_mode) return;

  const int unsupported_mode =
      (b0[0]->mode != NEARESTMV && b0[0]->mode != GLOBALMV);
  if (unsupported_mode) return;

  const int different_mv = (b0[0]->mv[0].as_int != b1[0]->mv[0].as_int ||
                            b0[0]->mv[0].as_int != b2[0]->mv[0].as_int ||
                            b0[0]->mv[0].as_int != b3[0]->mv[0].as_int);
  if (different_mv) return;

  const int unsupported_motion_mode =
      (b0[0]->motion_mode != b1[0]->motion_mode ||
       b0[0]->motion_mode != b2[0]->motion_mode ||
       b0[0]->motion_mode != b3[0]->motion_mode ||
       b0[0]->motion_mode != SIMPLE_TRANSLATION);
  if (unsupported_motion_mode) return;

  const int diffent_filter =
      (b0[0]->interp_filters.as_int != b1[0]->interp_filters.as_int ||
       b0[0]->interp_filters.as_int != b2[0]->interp_filters.as_int ||
       b0[0]->interp_filters.as_int != b3[0]->interp_filters.as_int);
  if (diffent_filter) return;

  const int different_seg = (b0[0]->segment_id != b1[0]->segment_id ||
                             b0[0]->segment_id != b2[0]->segment_id ||
                             b0[0]->segment_id != b3[0]->segment_id);
  if (different_seg) return;

  // Evaluate the ref_mv.
  MB_MODE_INFO **this_mi = mib;
  BLOCK_SIZE orig_bsize = this_mi[0]->bsize;
  const PARTITION_TYPE orig_partition = this_mi[0]->partition;

  this_mi[0]->bsize = bsize;
  this_mi[0]->partition = PARTITION_NONE;
  this_mi[0]->skip_txfm = 1;

  // TODO(yunqing): functions called below can be optimized by
  // removing unrelated operations.
  av1_set_offsets_without_segment_id(cpi, &tile_data->tile_info, x, mi_row,
                                     mi_col, bsize);

  const MV_REFERENCE_FRAME ref_frame = this_mi[0]->ref_frame[0];
  int_mv frame_mv[MB_MODE_COUNT][REF_FRAMES];
  struct buf_2d yv12_mb[REF_FRAMES][MAX_MB_PLANE];
  int force_skip_low_temp_var = 0;
  int skip_pred_mv = 0;
  bool use_scaled_ref;

  for (int i = 0; i < MB_MODE_COUNT; ++i) {
    for (int j = 0; j < REF_FRAMES; ++j) {
      frame_mv[i][j].as_int = INVALID_MV;
    }
  }
  av1_copy(x->color_sensitivity, x->color_sensitivity_sb);
  skip_pred_mv = (x->nonrd_prune_ref_frame_search > 2 &&
                  x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] != 2 &&
                  x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] != 2);

  find_predictors(cpi, x, ref_frame, frame_mv, yv12_mb, bsize,
                  force_skip_low_temp_var, skip_pred_mv, &use_scaled_ref);

  int continue_merging = 1;
  if (frame_mv[NEARESTMV][ref_frame].as_mv.row != b0[0]->mv[0].as_mv.row ||
      frame_mv[NEARESTMV][ref_frame].as_mv.col != b0[0]->mv[0].as_mv.col)
    continue_merging = 0;

  if (!continue_merging) {
    this_mi[0]->bsize = orig_bsize;
    this_mi[0]->partition = orig_partition;

    // TODO(yunqing): Store the results and restore here instead of
    // calling find_predictors() again.
    av1_set_offsets_without_segment_id(cpi, &tile_data->tile_info, x, mi_row,
                                       mi_col, this_mi[0]->bsize);
    find_predictors(cpi, x, ref_frame, frame_mv, yv12_mb, this_mi[0]->bsize,
                    force_skip_low_temp_var, skip_pred_mv, &use_scaled_ref);
  } else {
    struct scale_factors *sf = get_ref_scale_factors(cm, ref_frame);
    const int is_scaled = av1_is_scaled(sf);
    const int is_y_subpel_mv = (abs(this_mi[0]->mv[0].as_mv.row) % 8) ||
                               (abs(this_mi[0]->mv[0].as_mv.col) % 8);
    const int is_uv_subpel_mv = (abs(this_mi[0]->mv[0].as_mv.row) % 16) ||
                                (abs(this_mi[0]->mv[0].as_mv.col) % 16);

    if (cpi->ppi->use_svc || is_scaled || is_y_subpel_mv || is_uv_subpel_mv) {
      const int num_planes = av1_num_planes(cm);
      set_ref_ptrs(cm, xd, ref_frame, this_mi[0]->ref_frame[1]);
      const YV12_BUFFER_CONFIG *cfg = get_ref_frame_yv12_buf(cm, ref_frame);
      av1_setup_pre_planes(xd, 0, cfg, mi_row, mi_col,
                           xd->block_ref_scale_factors[0], num_planes);

      if (!cpi->ppi->use_svc && !is_scaled && !is_y_subpel_mv) {
        assert(is_uv_subpel_mv == 1);
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 1,
                                      num_planes - 1);
      } else {
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 0,
                                      num_planes - 1);
      }
    }

    // Copy out mbmi_ext information.
    MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
    MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame = x->mbmi_ext_frame;
    av1_copy_mbmi_ext_to_mbmi_ext_frame(
        mbmi_ext_frame, mbmi_ext, av1_ref_frame_type(this_mi[0]->ref_frame));

    const BLOCK_SIZE this_subsize =
        get_partition_subsize(bsize, this_mi[0]->partition);
    // Update partition contexts.
    update_ext_partition_context(xd, mi_row, mi_col, this_subsize, bsize,
                                 this_mi[0]->partition);

    const int num_planes = av1_num_planes(cm);
    av1_reset_entropy_context(xd, bsize, num_planes);

    // Note: use x->txfm_search_params.tx_mode_search_type instead of
    // cm->features.tx_mode here.
    TX_SIZE tx_size =
        tx_size_from_tx_mode(bsize, x->txfm_search_params.tx_mode_search_type);
    if (xd->lossless[this_mi[0]->segment_id]) tx_size = TX_4X4;
    this_mi[0]->tx_size = tx_size;
    memset(this_mi[0]->inter_tx_size, this_mi[0]->tx_size,
           sizeof(this_mi[0]->inter_tx_size));

    // Update txfm contexts.
    xd->above_txfm_context =
        cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
    xd->left_txfm_context =
        xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
    set_txfm_ctxs(this_mi[0]->tx_size, xd->width, xd->height,
                  this_mi[0]->skip_txfm && is_inter_block(this_mi[0]), xd);

    // Update mi for this partition block.
    for (int y = 0; y < bs; y++) {
      for (int x_idx = 0; x_idx < bs; x_idx++) {
        this_mi[x_idx + y * mi_params->mi_stride] = this_mi[0];
      }
    }
  }
}